

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_search_match_crossing_pages_Test::~Buffer_search_match_crossing_pages_Test
          (Buffer_search_match_crossing_pages_Test *this)

{
  Buffer_search_match_crossing_pages_Test *this_local;
  
  ~Buffer_search_match_crossing_pages_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, search_match_crossing_pages) {
    BufferWithReadonlyStrings local;

    size_t constexpr skip = 1;
    auto const needle = std::string{str1.substr(skip)} + std::string{str2.substr(0, std::size(str2)-1)};
    auto pos = size_t {};

    EXPECT_EQ(0, bfy_buffer_search_all(&local.buf, std::data(needle), std::size(needle), &pos));
    EXPECT_EQ(skip, pos);
}